

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

NodePtr __thiscall dh::analysis::proper_para_list(analysis *this)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  analysis *in_RSI;
  NodePtr NVar3;
  NodePtr tmp_cur_ptr;
  NodePtr tmp_in_ptr;
  TreeNode *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  TreeNode *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  undefined1 local_60 [32];
  FILE local_40 [16];
  
  para_decl(this);
  local_80 = *(TreeNode **)this;
  local_78._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((element_type *)local_78._M_pi != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((element_type *)local_78._M_pi)->upper_tab).
               super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(((element_type *)local_78._M_pi)->upper_tab).
                    super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((element_type *)local_78._M_pi)->upper_tab).
               super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(((element_type *)local_78._M_pi)->upper_tab).
                    super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
    }
  }
  while( true ) {
    token::getVal_abi_cxx11_
              ((string *)&local_70,
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    iVar1 = std::__cxx11::string::compare((char *)&local_70);
    _Var2._M_pi = extraout_RDX;
    if (local_70 != (TreeNode *)local_60) {
      operator_delete(local_70);
      _Var2._M_pi = extraout_RDX_00;
    }
    if (iVar1 != 0) break;
    local_60._16_8_ = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_60 + 0x10),",","");
    match(in_RSI,(string *)(local_60 + 0x10));
    if ((FILE *)local_60._16_8_ != local_40) {
      operator_delete((void *)local_60._16_8_);
    }
    para_decl((analysis *)&local_70);
    TreeNode::setSibling(local_80,(NodePtr *)&local_70);
    local_80 = local_70;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_78,&local_68);
    if ((element_type *)local_68._M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
    }
  }
  if ((element_type *)local_78._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
    _Var2._M_pi = extraout_RDX_01;
  }
  NVar3.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi
  ;
  NVar3.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar3.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::proper_para_list()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in proper_para_list\n";
#endif
	NodePtr ret = para_decl();

	NodePtr tmp_cur_ptr = ret;
	while(tmp->getVal() == ",")
	{
		match(",");
		NodePtr tmp_in_ptr = para_decl();
		tmp_cur_ptr->setSibling(tmp_in_ptr);
		tmp_cur_ptr = tmp_in_ptr;
	}

	return ret;
}